

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderIndexingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ShaderIndexingCase::setupUniforms
          (ShaderIndexingCase *this,int programID,Vec4 *constCoords)

{
  Vector<float,_2> VVar1;
  int iVar2;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar4;
  Vector<float,_4> VVar5;
  Vector<float,_3> VVar6;
  Vector<float,_2> local_98;
  float fStack_90;
  float fStack_8c;
  Vector<float,_4> local_88;
  Vec4 arr [4];
  long lVar3;
  
  iVar2 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  iVar2 = (**(code **)(lVar3 + 0xb48))(programID,"u_arr");
  if (iVar2 != -1) {
    switch(this->m_varType) {
    case TYPE_FLOAT:
      arr[0].m_data[0] = constCoords->m_data[0];
      arr[0].m_data[1] = arr[0].m_data[0] * 0.5;
      arr[0].m_data[2] = arr[0].m_data[0] * 0.25;
      arr[0].m_data[3] = arr[0].m_data[0] * 0.125;
      (**(code **)(lVar3 + 0x14e8))(iVar2,4);
      break;
    case TYPE_FLOAT_VEC2:
      arr[1].m_data[0] = 0.0;
      arr[1].m_data[1] = 0.0;
      arr[1].m_data[2] = 0.0;
      arr[1].m_data[3] = 0.0;
      arr[0].m_data[2] = 0.0;
      arr[0].m_data[3] = 0.0;
      local_98.m_data = *(float (*) [2])constCoords->m_data;
      arr[0].m_data[0] = local_98.m_data[0];
      arr[0].m_data[1] = local_98.m_data[1];
      tcu::operator*(0.5,&local_98);
      local_88.m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      tcu::operator*(0.25,(Vector<float,_2> *)&local_88);
      arr[1].m_data[0] = local_98.m_data[0];
      arr[1].m_data[1] = local_98.m_data[1];
      local_88.m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      VVar1 = tcu::operator*(0.125,(Vector<float,_2> *)&local_88);
      arr[1].m_data[2] = local_98.m_data[0];
      arr[1].m_data[3] = local_98.m_data[1];
      (**(code **)(lVar3 + 0x1528))(VVar1.m_data[0],iVar2,4,arr);
      break;
    case TYPE_FLOAT_VEC3:
      lVar4 = 0;
      do {
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)arr[0].m_data + lVar4));
        lVar4 = lVar4 + 0xc;
      } while (lVar4 != 0x30);
      arr[0].m_data[2] = constCoords->m_data[2];
      local_88.m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      arr[0].m_data[0] = local_88.m_data[0];
      arr[0].m_data[1] = local_88.m_data[1];
      local_88.m_data[2] = arr[0].m_data[2];
      tcu::operator*((tcu *)&local_98,0.5,(Vector<float,_3> *)&local_88);
      arr[1].m_data[1] = fStack_90;
      arr[0].m_data[3] = local_98.m_data[0];
      arr[1].m_data[0] = local_98.m_data[1];
      local_88.m_data[2] = constCoords->m_data[2];
      local_88.m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      tcu::operator*((tcu *)&local_98,0.25,(Vector<float,_3> *)&local_88);
      arr[2].m_data[0] = fStack_90;
      arr[1].m_data[2] = local_98.m_data[0];
      arr[1].m_data[3] = local_98.m_data[1];
      local_88.m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      local_88.m_data[2] = constCoords->m_data[2];
      VVar6 = tcu::operator*((tcu *)&local_98,0.125,(Vector<float,_3> *)&local_88);
      arr[2].m_data[3] = fStack_90;
      arr[2].m_data[1] = local_98.m_data[0];
      arr[2].m_data[2] = local_98.m_data[1];
      (**(code **)(lVar3 + 0x1568))(VVar6.m_data[0],VVar6.m_data[2],iVar2,4,arr);
      break;
    case TYPE_FLOAT_VEC4:
      lVar4 = 0;
      do {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)arr[0].m_data + lVar4));
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0x40);
      local_88.m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      local_88.m_data._8_8_ = *(undefined8 *)(constCoords->m_data + 2);
      arr[0].m_data[0] = local_88.m_data[0];
      arr[0].m_data[1] = local_88.m_data[1];
      arr[0].m_data[2] = local_88.m_data[2];
      arr[0].m_data[3] = local_88.m_data[3];
      tcu::operator*((tcu *)&local_98,0.5,&local_88);
      arr[1].m_data[0] = local_98.m_data[0];
      arr[1].m_data[1] = local_98.m_data[1];
      local_88.m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      local_88.m_data._8_8_ = *(undefined8 *)(constCoords->m_data + 2);
      tcu::operator*((tcu *)&local_98,0.25,&local_88);
      arr[2].m_data[0] = local_98.m_data[0];
      arr[2].m_data[1] = local_98.m_data[1];
      local_88.m_data._0_8_ = *(undefined8 *)constCoords->m_data;
      local_88.m_data._8_8_ = *(undefined8 *)(constCoords->m_data + 2);
      VVar5 = tcu::operator*((tcu *)&local_98,0.125,&local_88);
      arr[3].m_data[0] = local_98.m_data[0];
      arr[3].m_data[1] = local_98.m_data[1];
      arr[3].m_data[2] = fStack_90;
      arr[3].m_data[3] = fStack_8c;
      (**(code **)(lVar3 + 0x15a8))(local_98.m_data[0],VVar5.m_data._8_8_,iVar2,4,arr);
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)arr,"u_arr should not have location assigned in this test case",
                 (allocator<char> *)&local_98);
      tcu::TestError::TestError(this_00,(string *)arr);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return;
}

Assistant:

void ShaderIndexingCase::setupUniforms (int programID, const Vec4& constCoords)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	DE_UNREF(constCoords);

	int arrLoc = gl.getUniformLocation(programID, "u_arr");
	if (arrLoc != -1)
	{
		//int scalarSize = getDataTypeScalarSize(m_varType);
		if (m_varType == TYPE_FLOAT)
		{
			float arr[4];
			arr[0] = constCoords.x();
			arr[1] = constCoords.x() * 0.5f;
			arr[2] = constCoords.x() * 0.25f;
			arr[3] = constCoords.x() * 0.125f;
			gl.uniform1fv(arrLoc, 4, &arr[0]);
		}
		else if (m_varType == TYPE_FLOAT_VEC2)
		{
			Vec2 arr[4];
			arr[0] = constCoords.swizzle(0,1);
			arr[1] = constCoords.swizzle(0,1) * 0.5f;
			arr[2] = constCoords.swizzle(0,1) * 0.25f;
			arr[3] = constCoords.swizzle(0,1) * 0.125f;
			gl.uniform2fv(arrLoc, 4, arr[0].getPtr());
		}
		else if (m_varType == TYPE_FLOAT_VEC3)
		{
			Vec3 arr[4];
			arr[0] = constCoords.swizzle(0,1,2);
			arr[1] = constCoords.swizzle(0,1,2) * 0.5f;
			arr[2] = constCoords.swizzle(0,1,2) * 0.25f;
			arr[3] = constCoords.swizzle(0,1,2) * 0.125f;
			gl.uniform3fv(arrLoc, 4, arr[0].getPtr());
		}
		else if (m_varType == TYPE_FLOAT_VEC4)
		{
			Vec4 arr[4];
			arr[0] = constCoords.swizzle(0,1,2,3);
			arr[1] = constCoords.swizzle(0,1,2,3) * 0.5f;
			arr[2] = constCoords.swizzle(0,1,2,3) * 0.25f;
			arr[3] = constCoords.swizzle(0,1,2,3) * 0.125f;
			gl.uniform4fv(arrLoc, 4, arr[0].getPtr());
		}
		else
			throw tcu::TestError("u_arr should not have location assigned in this test case");
	}
}